

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileContainingSymbol
          (MergedDescriptorDatabase *this,string *symbol_name,FileDescriptorProto *output)

{
  pointer ppDVar1;
  DescriptorDatabase *pDVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  byte unaff_BPL;
  ulong uVar6;
  ulong uVar7;
  FileDescriptorProto temp;
  FileDescriptorProto FStack_108;
  
  uVar6 = 0;
  while( true ) {
    ppDVar1 = (this->sources_).
              super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)(this->sources_).
                  super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3;
    if (uVar7 <= uVar6) break;
    pDVar2 = ppDVar1[uVar6];
    iVar4 = (*pDVar2->_vptr_DescriptorDatabase[3])(pDVar2,symbol_name,output);
    if ((char)iVar4 != '\0') {
      FileDescriptorProto::FileDescriptorProto(&FStack_108);
      uVar3 = 0;
      goto LAB_0030b38f;
    }
    uVar6 = uVar6 + 1;
  }
  goto LAB_0030b3c6;
  while( true ) {
    pDVar2 = (this->sources_).
             super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5];
    iVar4 = (*pDVar2->_vptr_DescriptorDatabase[2])(pDVar2,(output->name_).ptr_,&FStack_108);
    uVar3 = uVar5 + 1;
    if ((char)iVar4 != '\0') break;
LAB_0030b38f:
    uVar5 = uVar3;
    if (uVar6 == uVar5) break;
  }
  unaff_BPL = uVar6 <= uVar5;
  FileDescriptorProto::~FileDescriptorProto(&FStack_108);
LAB_0030b3c6:
  return (bool)(uVar6 < uVar7 & unaff_BPL);
}

Assistant:

bool MergedDescriptorDatabase::FindFileContainingSymbol(
    const string& symbol_name,
    FileDescriptorProto* output) {
  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindFileContainingSymbol(symbol_name, output)) {
      // The symbol was found in source i.  However, if one of the previous
      // sources defines a file with the same name (which presumably doesn't
      // contain the symbol, since it wasn't found in that source), then we
      // must hide it from the caller.
      FileDescriptorProto temp;
      for (int j = 0; j < i; j++) {
        if (sources_[j]->FindFileByName(output->name(), &temp)) {
          // Found conflicting file in a previous source.
          return false;
        }
      }
      return true;
    }
  }
  return false;
}